

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O1

bool __thiscall ccs::Value::asBool(Value *this)

{
  bool bVar1;
  bad_coercion *this_00;
  runtime_error *this_01;
  ostringstream msg;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  switch(this->which_) {
  case String:
    bVar1 = CcsContext::coerceString<bool>(&this->strVal_,(bool *)local_198);
    if (!bVar1) {
      this_00 = (bad_coercion *)__cxa_allocate_exception(0x28);
      bad_coercion::bad_coercion(this_00,&this->name_,&this->strVal_);
LAB_0013201a:
      __cxa_throw(this_00,&bad_coercion::typeinfo,bad_coercion::~bad_coercion);
    }
    break;
  case Int:
    bVar1 = CcsContext::coerceString<bool>(&this->strVal_,(bool *)local_198);
    if (!bVar1) {
      this_00 = (bad_coercion *)__cxa_allocate_exception(0x28);
      bad_coercion::bad_coercion(this_00,&this->name_,&this->strVal_);
      goto LAB_0013201a;
    }
    break;
  case Double:
    bVar1 = CcsContext::coerceString<bool>(&this->strVal_,(bool *)local_198);
    if (!bVar1) {
      this_00 = (bad_coercion *)__cxa_allocate_exception(0x28);
      bad_coercion::bad_coercion(this_00,&this->name_,&this->strVal_);
      goto LAB_0013201a;
    }
    break;
  case Bool:
    local_198[0] = (ostringstream)(this->rawPrimVal_).boolVal;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Bad enum value ",0xf);
    std::ostream::operator<<((ostream *)local_198,this->which_);
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_01,asStack_1b8);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (bool)local_198[0];
}

Assistant:

bool Value::asBool() const
  { return accept<bool>(Caster<bool>(*this)); }